

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

UBool __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::following
          (DictionaryCache *this,int32_t fromPos,int32_t *result,int32_t *statusIndex)

{
  int iVar1;
  int32_t iVar2;
  int32_t r;
  int32_t *statusIndex_local;
  int32_t *result_local;
  int32_t fromPos_local;
  DictionaryCache *this_local;
  
  if ((fromPos < this->fLimit) && (this->fStart <= fromPos)) {
    if (((-1 < this->fPositionInCache) &&
        (iVar1 = this->fPositionInCache, iVar2 = UVector32::size(&this->fBreaks), iVar1 < iVar2)) &&
       (iVar2 = UVector32::elementAti(&this->fBreaks,this->fPositionInCache), iVar2 == fromPos)) {
      this->fPositionInCache = this->fPositionInCache + 1;
      iVar1 = this->fPositionInCache;
      iVar2 = UVector32::size(&this->fBreaks);
      if (iVar2 <= iVar1) {
        this->fPositionInCache = -1;
        return '\0';
      }
      iVar2 = UVector32::elementAti(&this->fBreaks,this->fPositionInCache);
      *result = iVar2;
      *statusIndex = this->fOtherRuleStatusIndex;
      return '\x01';
    }
    this->fPositionInCache = 0;
    while (iVar1 = this->fPositionInCache, iVar2 = UVector32::size(&this->fBreaks), iVar1 < iVar2) {
      iVar2 = UVector32::elementAti(&this->fBreaks,this->fPositionInCache);
      if (fromPos < iVar2) {
        *result = iVar2;
        *statusIndex = this->fOtherRuleStatusIndex;
        return '\x01';
      }
      this->fPositionInCache = this->fPositionInCache + 1;
    }
    this->fPositionInCache = -1;
  }
  else {
    this->fPositionInCache = -1;
  }
  return '\0';
}

Assistant:

UBool RuleBasedBreakIterator::DictionaryCache::following(int32_t fromPos, int32_t *result, int32_t *statusIndex) {
    if (fromPos >= fLimit || fromPos < fStart) {
        fPositionInCache = -1;
        return FALSE;
    }

    // Sequential iteration, move from previous boundary to the following

    int32_t r = 0;
    if (fPositionInCache >= 0 && fPositionInCache < fBreaks.size() && fBreaks.elementAti(fPositionInCache) == fromPos) {
        ++fPositionInCache;
        if (fPositionInCache >= fBreaks.size()) {
            fPositionInCache = -1;
            return FALSE;
        }
        r = fBreaks.elementAti(fPositionInCache);
        U_ASSERT(r > fromPos);
        *result = r;
        *statusIndex = fOtherRuleStatusIndex;
        return TRUE;
    }

    // Random indexing. Linear search for the boundary following the given position.

    for (fPositionInCache = 0; fPositionInCache < fBreaks.size(); ++fPositionInCache) {
        r= fBreaks.elementAti(fPositionInCache);
        if (r > fromPos) {
            *result = r;
            *statusIndex = fOtherRuleStatusIndex;
            return TRUE;
        }
    }
    U_ASSERT(FALSE);
    fPositionInCache = -1;
    return FALSE;
}